

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O2

size_t raviX_del_array_element(void *a,size_t element_size,size_t array_size,size_t i,size_t n)

{
  size_t sVar1;
  
  if (n + i <= array_size) {
    sVar1 = array_size - n;
    memmove((void *)(i * element_size + (long)a),(void *)((n + i) * element_size + (long)a),
            (sVar1 - i) * element_size);
    memset((void *)(sVar1 * element_size + (long)a),0,n * element_size);
    return sVar1;
  }
  __assert_fail("i + n <= array_size",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/allocate.c"
                ,0x53,"size_t raviX_del_array_element(void *, size_t, size_t, size_t, size_t)");
}

Assistant:

size_t raviX_del_array_element(void *a, size_t element_size, size_t array_size, size_t i, size_t n)
{
	assert(i + n <= array_size);
	char *p = (char *)a;
	char *dest = p + i * element_size;
	char const *src = p + (i + n) * element_size;
	size_t count = element_size * (array_size - n - i);
	memmove(dest, src, count);
	size_t new_array_size = array_size - n;
	size_t newsize = element_size * new_array_size;
	size_t oldsize = element_size * array_size;
	memset(p + newsize, 0, oldsize - newsize);
	return new_array_size;
}